

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int sx_hashtbl_add(sx_hashtbl *tbl,uint32_t key,int value)

{
  byte bVar1;
  uint32_t *puVar2;
  code *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (tbl->capacity <= tbl->count) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/hash.c",
                      0x11b,"tbl->count < tbl->capacity");
    pcVar3 = (code *)swi(3);
    iVar4 = (*pcVar3)();
    return iVar4;
  }
  bVar1 = (byte)tbl->_bitshift;
  uVar5 = (ulong)(key >> (bVar1 & 0x3f) ^ key) * -0x61c8864680b583eb >> (bVar1 & 0x3f);
  puVar2 = tbl->keys;
  iVar4 = (int)uVar5;
  uVar6 = uVar5 & 0xffffffff;
  if (puVar2[uVar6] != 0) {
    uVar6 = uVar5 & 0xffffffff;
    do {
      uVar6 = (ulong)((int)uVar6 + 1) % (ulong)(uint)tbl->capacity;
      iVar4 = (int)uVar6;
    } while (puVar2[uVar6] != 0);
  }
  puVar2[uVar6] = key;
  tbl->values[uVar6] = value;
  tbl->count = tbl->count + 1;
  return iVar4;
}

Assistant:

int sx_hashtbl_add(sx_hashtbl* tbl, uint32_t key, int value)
{
    sx_assert(tbl->count < tbl->capacity);

    uint32_t h = sx__fib_hash(key, tbl->_bitshift);
    uint32_t cnt = (uint32_t)tbl->capacity;
    while (tbl->keys[h] != 0) {
        h = (h + 1) % cnt;
    }

    sx_assert(tbl->keys[h] == 0);    // something went wrong!
    tbl->keys[h] = key;
    tbl->values[h] = value;
    ++tbl->count;
    return h;
}